

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
::rehash_and_grow_if_necessary
          (raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
           *this)

{
  size_t sVar1;
  size_t sVar2;
  raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
  *this_local;
  
  if (this->capacity_ == 0) {
    resize(this,1);
  }
  else {
    sVar1 = size(this);
    sVar2 = capacity(this);
    sVar2 = CapacityToGrowth(sVar2);
    if (sVar2 >> 1 < sVar1) {
      resize(this,this->capacity_ * 2 + 1);
    }
    else {
      drop_deletes_without_resize(this);
    }
  }
  return;
}

Assistant:

void rehash_and_grow_if_necessary() {
        if (capacity_ == 0) {
            resize(1);
        } else if (size() <= CapacityToGrowth(capacity()) / 2) {
            // Squash DELETED without growing if there is enough capacity.
            drop_deletes_without_resize();
        } else {
            // Otherwise grow the container.
            resize(capacity_ * 2 + 1);
        }
    }